

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevmousemanager.cpp
# Opt level: O2

void __thiscall QEvdevMouseManager::addMouse(QEvdevMouseManager *this,QString *deviceNode)

{
  QLoggingCategory *pQVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  Data *local_68;
  undefined1 local_60 [16];
  Data *local_50;
  char local_48 [24];
  QSocketNotifier *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::qLcEvdevMouse();
  if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_30 = (QSocketNotifier *)pQVar1->name;
    local_48[0] = '\x02';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_48[0x14] = 0;
    local_48[0x15] = 0;
    local_48[0x16] = 0;
    local_48[0x17] = 0;
    uVar2 = QString::utf16();
    QMessageLogger::debug(local_48,"Adding mouse at %ls",uVar2);
  }
  local_50 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QEvdevMouseHandler::create((QEvdevMouseHandler *)&local_50,deviceNode,&this->m_spec);
  if (local_50 == (Data *)0x0) {
    local_48[0] = '\x02';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[0x14] = 0;
    local_48[0x15] = 0;
    local_48[0x16] = 0;
    local_48[0x17] = 0;
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_30 = (QSocketNotifier *)0x10c189;
    uVar2 = QString::utf16();
    QMessageLogger::warning(local_48,"evdevmouse: Failed to open mouse device %ls",uVar2);
  }
  else {
    builtin_strncpy(local_48,"fi\x10",4);
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    QObject::
    connect<void(QEvdevMouseHandler::*)(int,int,bool,QFlags<Qt::MouseButton>,Qt::MouseButton,QEvent::Type),void(QEvdevMouseManager::*)(int,int,bool,QFlags<Qt::MouseButton>,Qt::MouseButton,QEvent::Type)>
              ((Object *)(local_60 + 8),(offset_in_QEvdevMouseHandler_to_subr)local_50,
               (ContextType *)QEvdevMouseHandler::handleMouseEvent,
               (offset_in_QEvdevMouseManager_to_subr *)0x0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)(local_60 + 8));
    builtin_strncpy(local_48,"$j\x10",4);
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    QObject::connect<void(QEvdevMouseHandler::*)(QPoint),void(QEvdevMouseManager::*)(QPoint)>
              ((Object *)local_60,(offset_in_QEvdevMouseHandler_to_subr)local_50,
               (ContextType *)QEvdevMouseHandler::handleWheelEvent,
               (offset_in_QEvdevMouseManager_to_subr *)0x0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_60);
    local_68 = local_50;
    local_50 = (Data *)0x0;
    QtInputSupport::DeviceHandlerList<QEvdevMouseHandler>::add
              (&this->m_mice,deviceNode,
               (unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>)&local_68);
    if (local_68 != (Data *)0x0) {
      (**(code **)(*(long *)&local_68->super_QArrayData + 0x20))();
    }
    local_68 = (Data *)0x0;
    updateDeviceCount(this);
  }
  if (local_50 != (Data *)0x0) {
    (**(code **)(*(long *)&local_50->super_QArrayData + 0x20))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevMouseManager::addMouse(const QString &deviceNode)
{
    qCDebug(qLcEvdevMouse, "Adding mouse at %ls", qUtf16Printable(deviceNode));
    auto handler = QEvdevMouseHandler::create(deviceNode, m_spec);
    if (handler) {
        connect(handler.get(), &QEvdevMouseHandler::handleMouseEvent,
                this, &QEvdevMouseManager::handleMouseEvent);
        connect(handler.get(), &QEvdevMouseHandler::handleWheelEvent,
                this, &QEvdevMouseManager::handleWheelEvent);
        m_mice.add(deviceNode, std::move(handler));
        updateDeviceCount();
    } else {
        qWarning("evdevmouse: Failed to open mouse device %ls", qUtf16Printable(deviceNode));
    }
}